

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O2

void av1_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  undefined1 (*pauVar16) [32];
  uint32_t *puVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  uint16_t *puVar21;
  undefined7 in_register_00000011;
  ulong uVar22;
  undefined1 (*pauVar23) [32];
  ulong uVar24;
  undefined4 *puVar25;
  ulong uVar26;
  int iVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  undefined4 *puVar30;
  int subblock_idx;
  int iVar31;
  long lVar32;
  undefined4 *puVar33;
  undefined1 (*pauVar34) [32];
  ulong uVar35;
  undefined1 (*pauVar36) [32];
  int row;
  undefined1 (*pauVar37) [32];
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar48 [16];
  double dVar43;
  undefined1 auVar45 [16];
  double dVar44;
  double dVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  double d_factor [4];
  __m256d subblock_mses_reg [4];
  uint16_t frame_sse [1088];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  int local_2bcc;
  undefined1 local_2ba0 [16];
  undefined1 local_2b90 [16];
  double local_2b68;
  double local_2b50;
  double local_2af0 [4];
  double local_2ad0 [4];
  undefined1 local_2ab0 [16];
  double local_2aa0 [4];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  double local_29e0;
  double dStack_29d8;
  double dStack_29d0;
  double dStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  double local_2960 [7];
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  ushort local_28e0 [16];
  undefined4 auStack_28c0 [8];
  undefined4 auStack_28a0 [528];
  int local_2060 [1024];
  undefined4 local_1060 [1036];
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar53 [32];
  
  uVar24 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  iVar27 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar31 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar31 < iVar27) {
    iVar27 = iVar31;
  }
  bVar2 = block_size_high[uVar24];
  dVar43 = (double)q_factor / 20.0;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar43 * dVar43;
  auVar40 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar45);
  auVar39 = vcmpsd_avx(auVar45,ZEXT816(0x3ee4f8b588e368f1),1);
  auVar59._8_8_ = 0x3ee4f8b588e368f1;
  auVar59._0_8_ = 0x3ee4f8b588e368f1;
  local_2ba0 = vblendvpd_avx(auVar40,auVar59,auVar39);
  dVar43 = (double)q_factor * 0.015625;
  bVar3 = block_size_wide[uVar24];
  local_2b68 = dVar43 * dVar43 * 0.5;
  dVar43 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar43;
  local_2b90 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar39);
  local_2aa0[0] = 0.0;
  local_2aa0[1] = 0.0;
  local_2aa0[2] = 0.0;
  local_2aa0[3] = 0.0;
  lVar32 = 0;
  memset(local_28e0,0,0x880);
  memset(local_2060,0,0x1000);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (double)iVar27 * 0.1;
  auVar39 = vmaxsd_avx(auVar40,ZEXT816(0x3ff0000000000000));
  for (; lVar32 != 4; lVar32 = lVar32 + 1) {
    auVar40 = vpmovsxwd_avx(ZEXT416((uint)subblock_mvs[lVar32]));
    auVar40 = vcvtdq2pd_avx(auVar40);
    dVar44 = auVar40._0_8_ * auVar40._0_8_;
    dVar55 = auVar40._8_8_ * auVar40._8_8_;
    auVar46._0_8_ = dVar44 + dVar55;
    auVar46._8_8_ = dVar44 + dVar55;
    auVar40 = vsqrtsd_avx(auVar46,auVar46);
    auVar47._0_8_ = auVar40._0_8_ / auVar39._0_8_;
    auVar47._8_8_ = auVar40._8_8_;
    auVar40 = vmaxsd_avx(auVar47,ZEXT816(0x3ff0000000000000));
    local_2aa0[lVar32] = auVar40._0_8_;
  }
  if (q_factor < 0x80) {
    local_2b68 = (double)local_2ba0._0_8_;
  }
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar43;
  auVar39 = vcmpsd_avx(auVar41,ZEXT816(0x3ee4f8b588e368f1),1);
  local_2ab0 = vblendvpd_avx(local_2b90,auVar59,auVar39);
  if (num_planes < 1) {
    num_planes = 0;
  }
  local_2bcc = 0;
  for (uVar24 = 0; uVar24 != (uint)num_planes; uVar24 = uVar24 + 1) {
    bVar18 = (byte)mbd->plane[uVar24].subsampling_y;
    bVar10 = bVar2 >> (bVar18 & 0x1f);
    uVar12 = (uint)bVar10;
    uVar14 = (ulong)uVar12;
    bVar19 = (byte)mbd->plane[uVar24].subsampling_x;
    bVar11 = bVar3 >> (bVar19 & 0x1f);
    uVar13 = (uint)bVar11;
    uVar15 = (ulong)uVar13;
    bVar19 = bVar19 - (char)mbd->plane[0].subsampling_x;
    bVar18 = bVar18 - (char)mbd->plane[0].subsampling_y;
    local_2b50 = 0.04;
    if (uVar24 != 0) {
      local_2b50 = 1.0 / (double)((1 << (bVar18 + bVar19 & 0x1f)) + 0x19);
    }
    uVar4 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar24 != 0) * 4 + -0x28);
    pauVar16 = (undefined1 (*) [32])
               (frame_to_filter->store_buf_adr[uVar24 - 4] +
               (int)(uVar13 * mb_col + uVar4 * uVar12 * mb_row));
    dVar43 = log(noise_levels[uVar24] + noise_levels[uVar24] + 5.0);
    if (uVar24 == 1) {
      uVar5 = 1 << (bVar19 & 0x1f);
      if (1 << (bVar19 & 0x1f) < 1) {
        uVar5 = 0;
      }
      uVar6 = 1 << (bVar18 & 0x1f);
      if (1 << (bVar18 & 0x1f) < 1) {
        uVar6 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        for (uVar26 = 0; uVar26 != uVar15; uVar26 = uVar26 + 1) {
          iVar27 = ((int)uVar26 << (bVar19 & 0x1f)) + ((int)uVar22 << (bVar18 & 0x1f)) * 0x22;
          for (uVar29 = 0; uVar35 = (ulong)uVar5, iVar31 = iVar27, uVar29 != uVar6;
              uVar29 = uVar29 + 1) {
            while (bVar38 = uVar35 != 0, uVar35 = uVar35 - 1, bVar38) {
              local_2060[uVar26 + uVar22 * 0x20] =
                   local_2060[uVar26 + uVar22 * 0x20] + (uint)local_28e0[iVar31];
              iVar31 = iVar31 + 1;
            }
            iVar27 = iVar27 + 0x22;
          }
        }
      }
    }
    lVar32 = (long)local_2bcc;
    pauVar36 = (undefined1 (*) [32])(pred + lVar32);
    if (uVar13 == 0x20) {
      pauVar23 = pauVar36;
      for (lVar20 = 0; uVar12 * 0x44 != (int)lVar20; lVar20 = lVar20 + 0x44) {
        auVar60 = vpmaxub_avx2(*pauVar16,*pauVar23);
        auVar51 = vpminub_avx2(*pauVar16,*pauVar23);
        auVar51 = vpsubusb_avx2(auVar60,auVar51);
        auVar60 = vpmovzxbw_avx2(auVar51._0_16_);
        auVar51 = vpmovzxbw_avx2(auVar51._16_16_);
        auVar60 = vpmullw_avx2(auVar60,auVar60);
        auVar51 = vpmullw_avx2(auVar51,auVar51);
        *(undefined1 (*) [32])((long)local_28e0 + lVar20) = auVar60;
        *(undefined1 (*) [32])((long)auStack_28c0 + lVar20) = auVar51;
        *(undefined4 *)((long)auStack_28a0 + lVar20) = 0;
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + uVar4);
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + uVar15);
      }
    }
    else {
      pauVar23 = pauVar36;
      for (lVar20 = 0; uVar12 * 0x44 != (int)lVar20; lVar20 = lVar20 + 0x44) {
        auVar60 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar16);
        auVar51 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar23);
        auVar60 = vpsubw_avx2(auVar60,auVar51);
        auVar60 = vpmullw_avx2(auVar60,auVar60);
        *(undefined1 (*) [32])((long)local_28e0 + lVar20) = auVar60;
        *(undefined4 *)((long)auStack_28c0 + lVar20) = 0;
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + uVar4);
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + uVar15);
      }
    }
    auVar60._8_4_ = 0x40e00000;
    auVar60._0_8_ = 0x40e0000040e00000;
    auVar60._12_4_ = 0x40e00000;
    auVar60._16_4_ = 0x40e00000;
    auVar60._20_4_ = 0x40e00000;
    auVar60._24_4_ = 0x40e00000;
    auVar60._28_4_ = 0x40e00000;
    dVar43 = (dVar43 + 0.5) * local_2b68 * (double)local_2ab0._0_8_;
    puVar17 = accum + lVar32;
    puVar21 = count + lVar32;
    puVar25 = local_1060;
    for (uVar22 = 0; uVar22 < uVar15; uVar22 = uVar22 + 4) {
      pauVar28 = (undefined1 (*) [16])(local_28e0 + (uVar22 - 2));
      if (uVar22 == 0) {
        pauVar28 = (undefined1 (*) [16])local_28e0;
      }
      for (lVar20 = 0x40; lVar20 != 0xa0; lVar20 = lVar20 + 0x20) {
        auVar39 = *pauVar28;
        if (uVar22 == 0) {
          auVar39 = vpshufd_avx(auVar39,0x94);
          auVar39 = vpshuflw_avx(auVar39,0x40);
        }
        if (uVar22 == uVar13 - 4) {
          auVar39 = vpshufhw_avx(auVar39,0x54);
        }
        auVar51 = vpmovzxwd_avx2(auVar39);
        *(undefined1 (*) [32])(local_2a80 + lVar20) = auVar51;
        pauVar28 = (undefined1 (*) [16])(pauVar28[4] + 4);
      }
      local_2a80 = local_2a40;
      local_2a60 = local_2a40;
      puVar30 = puVar25;
      for (uVar26 = 0; uVar26 != uVar14; uVar26 = uVar26 + 1) {
        auVar54 = ZEXT1664((undefined1  [16])0x0);
        for (lVar20 = 0; lVar20 != 0xa0; lVar20 = lVar20 + 0x20) {
          auVar51 = vpaddd_avx2(auVar54._0_32_,*(undefined1 (*) [32])(local_2a80 + lVar20));
          auVar54 = ZEXT3264(auVar51);
        }
        for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
          uVar7 = *(undefined8 *)(local_2a60 + lVar20 + 8);
          uVar8 = *(undefined8 *)(local_2a60 + lVar20 + 0x10);
          uVar9 = *(undefined8 *)(local_2a60 + lVar20 + 0x18);
          *(undefined8 *)(local_2a80 + lVar20) = *(undefined8 *)(local_2a60 + lVar20);
          *(undefined8 *)(local_2a80 + lVar20 + 8) = uVar7;
          *(undefined8 *)(local_2a80 + lVar20 + 0x10) = uVar8;
          *(undefined8 *)(local_2a80 + lVar20 + 0x18) = uVar9;
        }
        local_2a00 = local_2a20;
        if ((long)uVar26 <= (long)(int)(uVar12 - 4)) {
          auVar39 = *pauVar28;
          if (uVar22 == 0) {
            auVar39 = vpshufd_avx(auVar39,0x94);
            auVar39 = vpshuflw_avx(auVar39,0x40);
          }
          if (uVar22 == uVar13 - 4) {
            auVar39 = vpshufhw_avx(auVar39,0x54);
          }
          local_2a00 = vpmovzxwd_avx2(auVar39);
          pauVar28 = (undefined1 (*) [16])(pauVar28[4] + 4);
        }
        puVar33 = puVar30;
        for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
          auVar51 = vpand_avx2(auVar54._0_32_,*(undefined1 (*) [32])((long)sse_bytemask[0] + lVar20)
                              );
          auVar39 = vphaddd_avx(auVar51._16_16_,auVar51._0_16_);
          auVar39 = vphaddd_avx(auVar39,auVar39);
          auVar39 = vphaddd_avx(auVar39,auVar39);
          *puVar33 = auVar39._0_4_;
          puVar33 = puVar33 + 1;
        }
        puVar30 = puVar30 + 0x20;
      }
      puVar25 = puVar25 + 4;
    }
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      local_2ad0[lVar20] = (double)subblock_mses[lVar20] * 0.008333333333333333;
      local_2af0[lVar20] = (1.0 / dVar43) * local_2aa0[lVar20];
    }
    if (tf_wgt_calc_lvl == 0) {
      local_2b90._0_8_ = local_1060;
      local_2ba0._0_8_ = local_2060;
      lVar20 = 0;
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        lVar20 = (long)(int)lVar20;
        uVar26 = 0;
        while( true ) {
          if (uVar15 == uVar26) break;
          uVar35 = (ulong)(((uint)(bVar11 >> 1 <= uVar26) | (uint)(bVar10 >> 1 <= uVar22) * 2) << 3)
          ;
          dVar43 = ((double)(uint)(*(int *)(local_2ba0._0_8_ + uVar26 * 4) +
                                  *(int *)(local_2b90._0_8_ + uVar26 * 4)) * local_2b50 *
                    0.041666666666666664 + *(double *)((long)local_2ad0 + uVar35)) *
                   *(double *)((long)local_2af0 + uVar35);
          bVar18 = (*pauVar36)[uVar26];
          auVar49._0_8_ = -dVar43;
          auVar49._8_8_ = 0x8000000000000000;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = dVar43;
          auVar39 = vcmpsd_avx(auVar42,ZEXT816(0x401c000000000000),1);
          auVar56._8_8_ = 0xc01c000000000000;
          auVar56._0_8_ = 0xc01c000000000000;
          auVar39 = vblendvpd_avx(auVar56,auVar49,auVar39);
          dVar43 = exp(auVar39._0_8_);
          count[lVar32 + lVar20 + uVar26] =
               count[lVar32 + lVar20 + uVar26] + (short)(int)(dVar43 * 1000.0);
          accum[lVar32 + lVar20 + uVar26] =
               accum[lVar32 + lVar20 + uVar26] + (uint)bVar18 * (int)(dVar43 * 1000.0);
          uVar26 = uVar26 + 1;
        }
        lVar20 = lVar20 + uVar26;
        local_2ba0._0_8_ = local_2ba0._0_8_ + 0x80;
        local_2b90._0_8_ = local_2b90._0_8_ + 0x80;
        pauVar36 = (undefined1 (*) [32])(*pauVar36 + uVar15);
      }
    }
    else {
      local_2960[0] = local_2ad0[0];
      local_2960[1] = local_2ad0[0];
      local_2960[2] = local_2ad0[0];
      local_2960[3] = local_2ad0[0];
      local_2960[4] = local_2ad0[1];
      local_2960[5] = local_2ad0[1];
      local_2960[6] = local_2ad0[1];
      uStack_2928 = local_2ad0[1];
      local_2920 = local_2ad0[2];
      uStack_2918 = local_2ad0[2];
      uStack_2910 = local_2ad0[2];
      uStack_2908 = local_2ad0[2];
      local_2900 = local_2ad0[3];
      uStack_28f8 = local_2ad0[3];
      uStack_28f0 = local_2ad0[3];
      uStack_28e8 = local_2ad0[3];
      local_29e0 = local_2af0[0];
      dStack_29d8 = local_2af0[0];
      dStack_29d0 = local_2af0[0];
      dStack_29c8 = local_2af0[0];
      local_29c0 = local_2af0[1];
      uStack_29b8 = local_2af0[1];
      uStack_29b0 = local_2af0[1];
      uStack_29a8 = local_2af0[1];
      local_29a0 = local_2af0[2];
      uStack_2998 = local_2af0[2];
      uStack_2990 = local_2af0[2];
      uStack_2988 = local_2af0[2];
      local_2b90._0_8_ = CONCAT71(0,bVar10 >> 1);
      local_2ba0._0_8_ = CONCAT44(0,uVar13 * 4);
      pauVar16 = (undefined1 (*) [32])local_1060;
      pauVar23 = (undefined1 (*) [32])local_2060;
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        pauVar34 = pauVar23;
        pauVar37 = pauVar16;
        for (uVar26 = 0; uVar26 < uVar15; uVar26 = uVar26 + 8) {
          auVar51 = vlddqu_avx(*pauVar37);
          auVar50 = vlddqu_avx(*pauVar34);
          auVar51 = vpaddd_avx2(auVar50,auVar51);
          auVar50 = vcvtdq2pd_avx(auVar51._0_16_);
          auVar52 = vcvtdq2pd_avx(auVar51._16_16_);
          uVar35 = (ulong)(((uint)(bVar11 >> 1 <= uVar26) |
                           (uint)((ulong)local_2b90._0_8_ <= uVar22) * 2) << 5);
          dVar43 = *(double *)((long)local_2960 + uVar35 + 8);
          dVar44 = *(double *)((long)local_2960 + uVar35 + 0x10);
          dVar55 = *(double *)((long)local_2960 + uVar35 + 0x18);
          auVar51 = *(undefined1 (*) [32])((long)&local_29e0 + uVar35);
          auVar57._0_8_ =
               auVar51._0_8_ *
               (*(double *)((long)local_2960 + uVar35) +
               local_2b50 * auVar50._0_8_ * 0.041666666666666664);
          auVar57._8_8_ =
               auVar51._8_8_ * (dVar43 + local_2b50 * auVar50._8_8_ * 0.041666666666666664);
          auVar57._16_8_ =
               auVar51._16_8_ * (dVar44 + local_2b50 * auVar50._16_8_ * 0.041666666666666664);
          auVar57._24_8_ =
               auVar51._24_8_ * (dVar55 + local_2b50 * auVar50._24_8_ * 0.041666666666666664);
          auVar50._0_8_ =
               auVar51._0_8_ *
               (*(double *)((long)local_2960 + uVar35) +
               local_2b50 * auVar52._0_8_ * 0.041666666666666664);
          auVar50._8_8_ =
               auVar51._8_8_ * (dVar43 + local_2b50 * auVar52._8_8_ * 0.041666666666666664);
          auVar50._16_8_ =
               auVar51._16_8_ * (dVar44 + local_2b50 * auVar52._16_8_ * 0.041666666666666664);
          auVar50._24_8_ =
               auVar51._24_8_ * (dVar55 + local_2b50 * auVar52._24_8_ * 0.041666666666666664);
          auVar39 = vcvtpd2ps_avx(auVar57);
          auVar40 = vcvtpd2ps_avx(auVar50);
          auVar51._16_16_ = auVar40;
          auVar51._0_16_ = auVar39;
          auVar51 = vminps_avx(auVar51,auVar60);
          auVar51 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar51);
          auVar52._0_4_ = (int)(auVar51._0_4_ * 12102203.0);
          auVar52._4_4_ = (int)(auVar51._4_4_ * 12102203.0);
          auVar52._8_4_ = (int)(auVar51._8_4_ * 12102203.0);
          auVar52._12_4_ = (int)(auVar51._12_4_ * 12102203.0);
          auVar52._16_4_ = (int)(auVar51._16_4_ * 12102203.0);
          auVar52._20_4_ = (int)(auVar51._20_4_ * 12102203.0);
          auVar52._24_4_ = (int)(auVar51._24_4_ * 12102203.0);
          auVar52._28_4_ = (int)auVar51._28_4_;
          auVar58._8_4_ = 0x3f7f127f;
          auVar58._0_8_ = 0x3f7f127f3f7f127f;
          auVar58._12_4_ = 0x3f7f127f;
          auVar58._16_4_ = 0x3f7f127f;
          auVar58._20_4_ = 0x3f7f127f;
          auVar58._24_4_ = 0x3f7f127f;
          auVar58._28_4_ = 0x3f7f127f;
          auVar51 = vpaddd_avx2(auVar52,auVar58);
          auVar48._0_4_ = (int)(auVar51._0_4_ * 1000.0 + 0.5);
          auVar48._4_4_ = (int)(auVar51._4_4_ * 1000.0 + 0.5);
          auVar48._8_4_ = (int)(auVar51._8_4_ * 1000.0 + 0.5);
          auVar48._12_4_ = (int)(auVar51._12_4_ * 1000.0 + 0.5);
          auVar53._16_4_ = (int)(auVar51._16_4_ * 1000.0 + 0.5);
          auVar53._0_16_ = auVar48;
          auVar53._20_4_ = (int)(auVar51._20_4_ * 1000.0 + 0.5);
          auVar53._24_4_ = (int)(auVar51._24_4_ * 1000.0 + 0.5);
          auVar53._28_4_ = (int)(auVar51._28_4_ + 0.5);
          auVar39 = vpackusdw_avx(auVar48,auVar53._16_16_);
          auVar39 = vpaddw_avx(auVar39,*(undefined1 (*) [16])(puVar21 + uVar26));
          *(undefined1 (*) [16])(puVar21 + uVar26) = auVar39;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(*pauVar36 + uVar26);
          auVar51 = vpmovzxbd_avx2(auVar1);
          auVar51 = vpmulld_avx2(auVar53,auVar51);
          auVar51 = vpaddd_avx2(auVar51,*(undefined1 (*) [32])(puVar17 + uVar26));
          *(undefined1 (*) [32])(puVar17 + uVar26) = auVar51;
          pauVar34 = pauVar34 + 1;
          pauVar37 = pauVar37 + 1;
        }
        pauVar36 = (undefined1 (*) [32])(*pauVar36 + uVar15);
        puVar17 = (uint32_t *)((long)puVar17 + local_2ba0._0_8_);
        puVar21 = (uint16_t *)((long)puVar21 + (ulong)(uVar13 * 2));
        pauVar23 = pauVar23 + 4;
        pauVar16 = pauVar16 + 4;
      }
    }
    local_2bcc = uVar13 * uVar12 + local_2bcc;
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with avx2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with avx2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with avx2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}